

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_plane.cpp
# Opt level: O0

visplane_t * swrenderer::R_CheckPlane(visplane_t *pl,int start,int stop)

{
  int iVar1;
  int iVar2;
  fixed_t fVar3;
  bool bVar4;
  double f;
  visplane_t *new_pl;
  uint hash;
  int x;
  int unionh;
  int unionl;
  int intrh;
  int intrl;
  int stop_local;
  int start_local;
  visplane_t *pl_local;
  
  if (start < 0 || viewwidth <= start) {
    __assert_fail("start >= 0 && start < viewwidth",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/r_plane.cpp"
                  ,0x200,"visplane_t *swrenderer::R_CheckPlane(visplane_t *, int, int)");
  }
  if (stop <= start || viewwidth < stop) {
    __assert_fail("stop > start && stop <= viewwidth",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/r_plane.cpp"
                  ,0x201,"visplane_t *swrenderer::R_CheckPlane(visplane_t *, int, int)");
  }
  if (start < pl->left) {
    unionl = pl->left;
    x = start;
  }
  else {
    x = pl->left;
    unionl = start;
  }
  if (pl->right < stop) {
    unionh = pl->right;
    hash = stop;
  }
  else {
    hash = pl->right;
    unionh = stop;
  }
  new_pl._4_4_ = unionl;
  while( true ) {
    bVar4 = false;
    if (new_pl._4_4_ < unionh) {
      bVar4 = *(short *)(&pl->field_0xda + (long)new_pl._4_4_ * 2) == 0x7fff;
    }
    if (!bVar4) break;
    new_pl._4_4_ = new_pl._4_4_ + 1;
  }
  if (new_pl._4_4_ < unionh) {
    if (((pl->portal == (FSectorPortal *)0x0) || ((pl->portal->mFlags & 2U) != 0)) || (!viewactive))
    {
      iVar2 = FTextureID::GetIndex(&pl->picnum);
      iVar1 = pl->lightlevel;
      f = secplane_t::fD(&pl->height);
      fVar3 = FloatToFixed(f);
      new_pl._0_4_ = iVar2 * 3 + iVar1 + fVar3 * 7 & 0x7f;
    }
    else {
      new_pl._0_4_ = 0x80;
    }
    _stop_local = new_visplane((uint)new_pl);
    secplane_t::operator=(&_stop_local->height,&pl->height);
    (_stop_local->picnum).texnum = (pl->picnum).texnum;
    _stop_local->lightlevel = pl->lightlevel;
    FTransform::operator=(&_stop_local->xform,&pl->xform);
    _stop_local->colormap = pl->colormap;
    _stop_local->portal = pl->portal;
    _stop_local->extralight = pl->extralight;
    _stop_local->visibility = pl->visibility;
    TVector3<double>::operator=(&_stop_local->viewpos,&pl->viewpos);
    TAngle<double>::operator=(&_stop_local->viewangle,&pl->viewangle);
    _stop_local->sky = pl->sky;
    _stop_local->Alpha = pl->Alpha;
    _stop_local->Additive = (bool)(pl->Additive & 1);
    _stop_local->CurrentPortalUniq = pl->CurrentPortalUniq;
    _stop_local->MirrorFlags = pl->MirrorFlags;
    _stop_local->CurrentSkybox = pl->CurrentSkybox;
    _stop_local->left = start;
    _stop_local->right = stop;
    fillshort(&_stop_local->field_0xda,viewwidth,0x7fff);
  }
  else {
    pl->left = x;
    pl->right = hash;
    _stop_local = pl;
  }
  return _stop_local;
}

Assistant:

visplane_t *R_CheckPlane (visplane_t *pl, int start, int stop)
{
	int intrl, intrh;
	int unionl, unionh;
	int x;

	assert (start >= 0 && start < viewwidth);
	assert (stop > start && stop <= viewwidth);

	if (start < pl->left)
	{
		intrl = pl->left;
		unionl = start;
	}
	else
	{
		unionl = pl->left;
		intrl = start;
	}
		
	if (stop > pl->right)
	{
		intrh = pl->right;
		unionh = stop;
	}
	else
	{
		unionh = pl->right;
		intrh = stop;
	}

	for (x = intrl; x < intrh && pl->top[x] == 0x7fff; x++)
		;

	if (x >= intrh)
	{
		// use the same visplane
		pl->left = unionl;
		pl->right = unionh;
	}
	else
	{
		// make a new visplane
		unsigned hash;

		if (pl->portal != NULL && !(pl->portal->mFlags & PORTSF_INSKYBOX) && viewactive)
		{
			hash = MAXVISPLANES;
		}
		else
		{
			hash = visplane_hash (pl->picnum.GetIndex(), pl->lightlevel, pl->height);
		}
		visplane_t *new_pl = new_visplane (hash);

		new_pl->height = pl->height;
		new_pl->picnum = pl->picnum;
		new_pl->lightlevel = pl->lightlevel;
		new_pl->xform = pl->xform;
		new_pl->colormap = pl->colormap;
		new_pl->portal = pl->portal;
		new_pl->extralight = pl->extralight;
		new_pl->visibility = pl->visibility;
		new_pl->viewpos = pl->viewpos;
		new_pl->viewangle = pl->viewangle;
		new_pl->sky = pl->sky;
		new_pl->Alpha = pl->Alpha;
		new_pl->Additive = pl->Additive;
		new_pl->CurrentPortalUniq = pl->CurrentPortalUniq;
		new_pl->MirrorFlags = pl->MirrorFlags;
		new_pl->CurrentSkybox = pl->CurrentSkybox;
		pl = new_pl;
		pl->left = start;
		pl->right = stop;
		fillshort (pl->top, viewwidth, 0x7fff);
	}
	return pl;
}